

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O0

bool __thiscall QToolButtonPrivate::hasMenu(QToolButtonPrivate *this)

{
  bool bVar1;
  QMenu *pQVar2;
  qsizetype qVar3;
  long in_RDI;
  
  if ((*(long *)(in_RDI + 0x2f0) != 0) &&
     (pQVar2 = QAction::menu<QMenu*>((QAction *)0x708ae2), pQVar2 != (QMenu *)0x0)) {
    return true;
  }
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QAction> *)0x708b02);
  if (bVar1) {
    QPointer<QAction>::operator->((QPointer<QAction> *)0x708b19);
    pQVar2 = QAction::menu<QMenu*>((QAction *)0x708b21);
    if (pQVar2 != (QMenu *)0x0) {
      return true;
    }
  }
  qVar3 = QList<QAction_*>::size((QList<QAction_*> *)(in_RDI + 0x220));
  return (int)(uint)(*(long *)(in_RDI + 0x2f0) != 0) < qVar3;
}

Assistant:

bool QToolButtonPrivate::hasMenu() const
{
    return ((defaultAction && defaultAction->menu())
            || (menuAction && menuAction->menu())
            || actions.size() > (defaultAction ? 1 : 0));
}